

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O3

void aom_highbd_lpf_vertical_6_sse2
               (uint16_t *s,int p,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  uint16_t *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  uint16_t uVar36;
  uint16_t uVar37;
  uint16_t uVar38;
  uint16_t uVar39;
  uint16_t uVar40;
  uint16_t uVar41;
  uint16_t uVar42;
  uint16_t uVar43;
  uint16_t uVar44;
  uint16_t uVar45;
  uint16_t uVar46;
  uint16_t uVar47;
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined8 uVar59;
  undefined1 auVar60 [16];
  short sVar61;
  undefined8 uVar62;
  short sVar67;
  short sVar68;
  undefined1 auVar63 [16];
  short sVar69;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  short sVar70;
  short sVar76;
  short sVar77;
  short sVar78;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar79 [16];
  short sVar84;
  short sVar85;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  short sVar87;
  short sVar93;
  short sVar94;
  short sVar95;
  undefined1 auVar92 [16];
  short sVar96;
  short sVar99;
  short sVar100;
  short sVar101;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  ushort uVar107;
  ushort uVar114;
  ushort uVar116;
  ushort uVar117;
  ushort uVar118;
  ushort uVar119;
  ushort uVar120;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  ushort uVar121;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined4 uVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  short sVar129;
  short sVar137;
  short sVar138;
  short sVar139;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  ushort uVar140;
  ushort uVar142;
  ushort uVar143;
  ushort uVar144;
  ushort uVar145;
  ushort uVar146;
  ushort uVar147;
  ushort uVar148;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  short sVar115;
  short sVar122;
  short sVar141;
  
  auVar103 = *(undefined1 (*) [16])(s + -3);
  puVar1 = s + (long)p + -3;
  uVar36 = *puVar1;
  uVar37 = puVar1[1];
  uVar38 = puVar1[2];
  uVar39 = puVar1[3];
  uVar40 = puVar1[4];
  uVar41 = puVar1[5];
  auVar63 = *(undefined1 (*) [16])(s + (long)(p * 2) + -3);
  puVar1 = s + (long)(p * 3) + -3;
  uVar42 = *puVar1;
  uVar43 = puVar1[1];
  uVar44 = puVar1[2];
  uVar45 = puVar1[3];
  uVar46 = puVar1[4];
  uVar47 = puVar1[5];
  sVar95 = auVar103._6_2_;
  auVar91._0_12_ = auVar103._0_12_;
  auVar91._12_2_ = sVar95;
  auVar91._14_2_ = uVar39;
  auVar90._12_4_ = auVar91._12_4_;
  auVar90._0_10_ = auVar103._0_10_;
  auVar90._10_2_ = uVar38;
  sVar94 = auVar103._4_2_;
  auVar89._10_6_ = auVar90._10_6_;
  auVar89._0_8_ = auVar103._0_8_;
  auVar89._8_2_ = sVar94;
  auVar48._4_8_ = auVar89._8_8_;
  auVar48._2_2_ = uVar37;
  sVar93 = auVar103._2_2_;
  auVar48._0_2_ = sVar93;
  sVar87 = auVar103._0_2_;
  auVar88._0_4_ = CONCAT22(uVar36,sVar87);
  auVar88._4_12_ = auVar48;
  sVar78 = auVar63._6_2_;
  auVar73._0_12_ = auVar63._0_12_;
  auVar73._12_2_ = sVar78;
  auVar73._14_2_ = uVar45;
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._0_10_ = auVar63._0_10_;
  auVar72._10_2_ = uVar44;
  sVar77 = auVar63._4_2_;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._0_8_ = auVar63._0_8_;
  auVar71._8_2_ = sVar77;
  auVar49._4_8_ = auVar71._8_8_;
  auVar49._2_2_ = uVar43;
  sVar76 = auVar63._2_2_;
  auVar49._0_2_ = sVar76;
  sVar70 = auVar63._0_2_;
  auVar74._4_4_ = auVar49._0_4_;
  auVar106._0_8_ = auVar88._0_8_;
  auVar106._8_4_ = auVar48._0_4_;
  auVar106._12_4_ = auVar74._4_4_;
  auVar81._8_8_ = auVar106._8_8_;
  uVar59 = CONCAT44(CONCAT22(uVar42,sVar70),auVar88._0_4_);
  auVar92._0_8_ = CONCAT44(auVar71._8_4_,auVar89._8_4_);
  auVar92._8_4_ = auVar90._12_4_;
  auVar92._12_4_ = auVar72._12_4_;
  auVar74._0_4_ = auVar48._0_4_;
  sVar67 = auVar103._8_2_;
  sVar68 = auVar103._10_2_;
  auVar134._0_8_ = CONCAT26(uVar41,CONCAT24(sVar68,CONCAT22(uVar40,sVar67)));
  sVar84 = auVar63._8_2_;
  sVar85 = auVar63._10_2_;
  auVar134._8_4_ = (int)((ulong)auVar134._0_8_ >> 0x20);
  auVar134._12_4_ = (int)(CONCAT26(uVar47,CONCAT24(sVar85,CONCAT22(uVar46,sVar84))) >> 0x20);
  uVar62 = CONCAT44(CONCAT22(uVar46,sVar84),CONCAT22(uVar40,sVar67));
  auVar74._8_8_ = uVar62;
  auVar103 = *(undefined1 (*) [16])blimit;
  auVar15[0xd] = 0;
  auVar15._0_13_ = auVar103._0_13_;
  auVar15[0xe] = auVar103[7];
  auVar18[0xc] = auVar103[6];
  auVar18._0_12_ = auVar103._0_12_;
  auVar18._13_2_ = auVar15._13_2_;
  auVar21[0xb] = 0;
  auVar21._0_11_ = auVar103._0_11_;
  auVar21._12_3_ = auVar18._12_3_;
  auVar24[10] = auVar103[5];
  auVar24._0_10_ = auVar103._0_10_;
  auVar24._11_4_ = auVar21._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar103._0_9_;
  auVar27._10_5_ = auVar24._10_5_;
  auVar30[8] = auVar103[4];
  auVar30._0_8_ = auVar103._0_8_;
  auVar30._9_6_ = auVar27._9_6_;
  auVar50._7_8_ = 0;
  auVar50._0_7_ = auVar30._8_7_;
  auVar53._1_8_ = SUB158(auVar50 << 0x40,7);
  auVar53[0] = auVar103[3];
  auVar53._9_6_ = 0;
  auVar54._1_10_ = SUB1510(auVar53 << 0x30,5);
  auVar54[0] = auVar103[2];
  auVar54._11_4_ = 0;
  auVar33[2] = auVar103[1];
  auVar33._0_2_ = auVar103._0_2_;
  auVar33._3_12_ = SUB1512(auVar54 << 0x20,3);
  auVar105._0_2_ = auVar103._0_2_ & 0xff;
  auVar105._2_13_ = auVar33._2_13_;
  auVar105[0xf] = 0;
  auVar63 = ZEXT416(bd - 8);
  auVar106 = psllw(auVar105,auVar63);
  auVar103 = *(undefined1 (*) [16])limit;
  auVar16[0xd] = 0;
  auVar16._0_13_ = auVar103._0_13_;
  auVar16[0xe] = auVar103[7];
  auVar19[0xc] = auVar103[6];
  auVar19._0_12_ = auVar103._0_12_;
  auVar19._13_2_ = auVar16._13_2_;
  auVar22[0xb] = 0;
  auVar22._0_11_ = auVar103._0_11_;
  auVar22._12_3_ = auVar19._12_3_;
  auVar25[10] = auVar103[5];
  auVar25._0_10_ = auVar103._0_10_;
  auVar25._11_4_ = auVar22._11_4_;
  auVar28[9] = 0;
  auVar28._0_9_ = auVar103._0_9_;
  auVar28._10_5_ = auVar25._10_5_;
  auVar31[8] = auVar103[4];
  auVar31._0_8_ = auVar103._0_8_;
  auVar31._9_6_ = auVar28._9_6_;
  auVar51._7_8_ = 0;
  auVar51._0_7_ = auVar31._8_7_;
  auVar55._1_8_ = SUB158(auVar51 << 0x40,7);
  auVar55[0] = auVar103[3];
  auVar55._9_6_ = 0;
  auVar56._1_10_ = SUB1510(auVar55 << 0x30,5);
  auVar56[0] = auVar103[2];
  auVar56._11_4_ = 0;
  auVar34[2] = auVar103[1];
  auVar34._0_2_ = auVar103._0_2_;
  auVar34._3_12_ = SUB1512(auVar56 << 0x20,3);
  auVar108._0_2_ = auVar103._0_2_ & 0xff;
  auVar108._2_13_ = auVar34._2_13_;
  auVar108[0xf] = 0;
  auVar109 = psllw(auVar108,auVar63);
  auVar103 = *(undefined1 (*) [16])thresh;
  auVar17[0xd] = 0;
  auVar17._0_13_ = auVar103._0_13_;
  auVar17[0xe] = auVar103[7];
  auVar20[0xc] = auVar103[6];
  auVar20._0_12_ = auVar103._0_12_;
  auVar20._13_2_ = auVar17._13_2_;
  auVar23[0xb] = 0;
  auVar23._0_11_ = auVar103._0_11_;
  auVar23._12_3_ = auVar20._12_3_;
  auVar26[10] = auVar103[5];
  auVar26._0_10_ = auVar103._0_10_;
  auVar26._11_4_ = auVar23._11_4_;
  auVar29[9] = 0;
  auVar29._0_9_ = auVar103._0_9_;
  auVar29._10_5_ = auVar26._10_5_;
  auVar32[8] = auVar103[4];
  auVar32._0_8_ = auVar103._0_8_;
  auVar32._9_6_ = auVar29._9_6_;
  auVar52._7_8_ = 0;
  auVar52._0_7_ = auVar32._8_7_;
  auVar57._1_8_ = SUB158(auVar52 << 0x40,7);
  auVar57[0] = auVar103[3];
  auVar57._9_6_ = 0;
  auVar58._1_10_ = SUB1510(auVar57 << 0x30,5);
  auVar58[0] = auVar103[2];
  auVar58._11_4_ = 0;
  auVar35[2] = auVar103[1];
  auVar35._0_2_ = auVar103._0_2_;
  auVar35._3_12_ = SUB1512(auVar58 << 0x20,3);
  auVar124._0_2_ = auVar103._0_2_ & 0xff;
  auVar124._2_13_ = auVar35._2_13_;
  auVar124[0xf] = 0;
  auVar125 = psllw(auVar124,auVar63);
  auVar79._8_8_ = auVar134._8_8_;
  auVar79._0_8_ = uVar59;
  auVar81._0_8_ = auVar92._0_8_;
  auVar80._8_8_ = uVar62;
  auVar80._0_8_ = auVar92._8_8_;
  auVar102._8_8_ = auVar81._8_8_;
  auVar102._0_8_ = auVar92._0_8_;
  auVar103 = psubusw(auVar102,auVar80);
  auVar130 = psubusw(auVar80,auVar81);
  auVar130 = auVar130 | auVar103;
  auVar103 = paddusw(auVar130,auVar130);
  auVar104._0_8_ = auVar103._0_8_;
  auVar104._8_8_ = 0;
  auVar131._0_2_ = auVar130._8_2_ >> 1;
  auVar131._2_2_ = auVar130._10_2_ >> 1;
  auVar131._4_2_ = auVar130._12_2_ >> 1;
  auVar131._6_2_ = auVar130._14_2_ >> 1;
  auVar131._8_8_ = 0;
  auVar103 = paddusw(auVar131,auVar104);
  auVar103 = auVar103 ^ _DAT_004df9f0;
  auVar106 = auVar106 ^ _DAT_004df9f0;
  auVar132._0_2_ = -(ushort)(auVar106._0_2_ < auVar103._0_2_);
  auVar132._2_2_ = -(ushort)(auVar106._2_2_ < auVar103._2_2_);
  auVar132._4_2_ = -(ushort)(auVar106._4_2_ < auVar103._4_2_);
  auVar132._6_2_ = -(ushort)(auVar106._6_2_ < auVar103._6_2_);
  auVar132._8_2_ = -(ushort)(auVar106._8_2_ < auVar103._8_2_);
  auVar132._10_2_ = -(ushort)(auVar106._10_2_ < auVar103._10_2_);
  auVar132._12_2_ = -(ushort)(auVar106._12_2_ < auVar103._12_2_);
  auVar132._14_2_ = -(ushort)(auVar106._14_2_ < auVar103._14_2_);
  auVar106 = paddusw(auVar109,_DAT_0051a5b0);
  auVar106 = auVar106 & auVar132;
  auVar130 = psubusw(auVar92,auVar74);
  auVar103 = psubusw(auVar74,auVar92);
  auVar103 = auVar103 | auVar130;
  auVar133._8_8_ = auVar134._8_8_;
  auVar133._0_8_ = uVar59;
  auVar134 = psubusw(auVar133,auVar74);
  auVar130 = psubusw(auVar74,auVar79);
  auVar130 = auVar130 | auVar134;
  sVar2 = auVar103._0_2_;
  sVar129 = auVar103._8_2_;
  auVar135._0_2_ = (ushort)(sVar129 < sVar2) * sVar2 | (ushort)(sVar129 >= sVar2) * sVar129;
  sVar3 = auVar103._2_2_;
  sVar137 = auVar103._10_2_;
  auVar135._2_2_ = (ushort)(sVar137 < sVar3) * sVar3 | (ushort)(sVar137 >= sVar3) * sVar137;
  sVar4 = auVar103._4_2_;
  sVar138 = auVar103._12_2_;
  auVar135._4_2_ = (ushort)(sVar138 < sVar4) * sVar4 | (ushort)(sVar138 >= sVar4) * sVar138;
  sVar5 = auVar103._6_2_;
  sVar139 = auVar103._14_2_;
  auVar135._6_2_ = (ushort)(sVar139 < sVar5) * sVar5 | (ushort)(sVar139 >= sVar5) * sVar139;
  sVar99 = (ushort)(0 < sVar129) * sVar129;
  auVar135._8_2_ = sVar99;
  sVar96 = (ushort)(0 < sVar137) * sVar137;
  auVar135._10_2_ = sVar96;
  sVar101 = (ushort)(0 < sVar138) * sVar138;
  auVar135._12_2_ = sVar101;
  sVar100 = (ushort)(0 < sVar139) * sVar139;
  auVar135._14_2_ = sVar100;
  sVar141 = auVar130._0_2_;
  uVar140 = (sVar141 < (short)auVar135._0_2_) * auVar135._0_2_ |
            (ushort)(sVar141 >= (short)auVar135._0_2_) * sVar141;
  sVar141 = auVar130._2_2_;
  uVar142 = (sVar141 < (short)auVar135._2_2_) * auVar135._2_2_ |
            (ushort)(sVar141 >= (short)auVar135._2_2_) * sVar141;
  sVar141 = auVar130._4_2_;
  uVar143 = (sVar141 < (short)auVar135._4_2_) * auVar135._4_2_ |
            (ushort)(sVar141 >= (short)auVar135._4_2_) * sVar141;
  sVar141 = auVar130._6_2_;
  uVar144 = (sVar141 < (short)auVar135._6_2_) * auVar135._6_2_ |
            (ushort)(sVar141 >= (short)auVar135._6_2_) * sVar141;
  sVar141 = auVar130._8_2_;
  uVar145 = (ushort)(sVar141 < sVar99) * sVar99 | (ushort)(sVar141 >= sVar99) * sVar141;
  sVar99 = auVar130._10_2_;
  uVar146 = (ushort)(sVar99 < sVar96) * sVar96 | (ushort)(sVar99 >= sVar96) * sVar99;
  sVar96 = auVar130._12_2_;
  sVar99 = auVar130._14_2_;
  uVar147 = (ushort)(sVar96 < sVar101) * sVar101 | (ushort)(sVar96 >= sVar101) * sVar96;
  uVar148 = (ushort)(sVar99 < sVar100) * sVar100 | (ushort)(sVar99 >= sVar100) * sVar99;
  auVar135 = auVar135 ^ _DAT_004df9f0;
  auVar125 = auVar125 ^ _DAT_004df9f0;
  auVar136._0_4_ =
       CONCAT22(-(ushort)(auVar125._2_2_ < auVar135._2_2_),
                -(ushort)(auVar125._0_2_ < auVar135._0_2_));
  sVar96 = auVar106._0_2_;
  uVar140 = (ushort)((short)uVar140 < sVar96) * sVar96 | ((short)uVar140 >= sVar96) * uVar140;
  sVar96 = auVar106._2_2_;
  uVar142 = (ushort)((short)uVar142 < sVar96) * sVar96 | ((short)uVar142 >= sVar96) * uVar142;
  sVar96 = auVar106._4_2_;
  uVar143 = (ushort)((short)uVar143 < sVar96) * sVar96 | ((short)uVar143 >= sVar96) * uVar143;
  sVar96 = auVar106._6_2_;
  uVar144 = (ushort)((short)uVar144 < sVar96) * sVar96 | ((short)uVar144 >= sVar96) * uVar144;
  sVar96 = auVar106._8_2_;
  uVar145 = (ushort)((short)uVar145 < sVar96) * sVar96 | ((short)uVar145 >= sVar96) * uVar145;
  sVar96 = auVar106._10_2_;
  uVar146 = (ushort)((short)uVar146 < sVar96) * sVar96 | ((short)uVar146 >= sVar96) * uVar146;
  sVar96 = auVar106._12_2_;
  uVar147 = (ushort)((short)uVar147 < sVar96) * sVar96 | ((short)uVar147 >= sVar96) * uVar147;
  sVar96 = auVar106._14_2_;
  uVar148 = (ushort)((short)uVar148 < sVar96) * sVar96 | ((short)uVar148 >= sVar96) * uVar148;
  auVar103 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar103 = pshuflw(auVar103,auVar103,0);
  uVar123 = auVar103._0_4_;
  auVar128._4_4_ = uVar123;
  auVar128._0_4_ = uVar123;
  auVar128._8_4_ = uVar123;
  auVar128._12_4_ = uVar123;
  auVar136._4_4_ =
       (undefined4)
       (CONCAT26(-(ushort)(auVar125._6_2_ < auVar135._6_2_),
                 CONCAT24(-(ushort)(auVar125._4_2_ < auVar135._4_2_),auVar136._0_4_)) >> 0x20);
  auVar136._8_4_ = auVar136._0_4_;
  auVar136._12_4_ = auVar136._4_4_;
  auVar126._0_2_ =
       ((short)uVar145 < (short)uVar140) * uVar140 | ((short)uVar145 >= (short)uVar140) * uVar145;
  auVar126._2_2_ =
       ((short)uVar146 < (short)uVar142) * uVar142 | ((short)uVar146 >= (short)uVar142) * uVar146;
  auVar126._4_2_ =
       ((short)uVar147 < (short)uVar143) * uVar143 | ((short)uVar147 >= (short)uVar143) * uVar147;
  auVar126._6_2_ =
       ((short)uVar148 < (short)uVar144) * uVar144 | ((short)uVar148 >= (short)uVar144) * uVar148;
  auVar126._8_2_ = (0 < (short)uVar145) * uVar145;
  auVar126._10_2_ = (0 < (short)uVar146) * uVar146;
  auVar126._12_2_ = (0 < (short)uVar147) * uVar147;
  auVar126._14_2_ = (0 < (short)uVar148) * uVar148;
  auVar109 = psubusw(auVar126,auVar109);
  auVar103 = psllw(_DAT_0051a5b0,ZEXT416((uint)bd));
  auVar110._8_4_ = 0xffffffff;
  auVar110._0_8_ = 0xffffffffffffffff;
  auVar110._12_4_ = 0xffffffff;
  auVar103 = paddsw(auVar103,auVar110);
  auVar134 = psubsw(auVar103,auVar128);
  auVar130 = psubsw((undefined1  [16])0x0,auVar128);
  auVar103 = psubsw(auVar81,auVar128);
  auVar81 = psubsw(auVar80,auVar128);
  auVar106 = psubsw(auVar103,auVar81);
  sVar115 = auVar134._0_2_;
  sVar96 = auVar106._0_2_;
  uVar140 = (ushort)(sVar115 < sVar96) * sVar115 | (ushort)(sVar115 >= sVar96) * sVar96;
  sVar122 = auVar134._2_2_;
  sVar96 = auVar106._2_2_;
  uVar142 = (ushort)(sVar122 < sVar96) * sVar122 | (ushort)(sVar122 >= sVar96) * sVar96;
  sVar9 = auVar134._4_2_;
  sVar96 = auVar106._4_2_;
  uVar143 = (ushort)(sVar9 < sVar96) * sVar9 | (ushort)(sVar9 >= sVar96) * sVar96;
  sVar10 = auVar134._6_2_;
  sVar96 = auVar106._6_2_;
  uVar144 = (ushort)(sVar10 < sVar96) * sVar10 | (ushort)(sVar10 >= sVar96) * sVar96;
  sVar11 = auVar134._8_2_;
  sVar96 = auVar106._8_2_;
  uVar145 = (ushort)(sVar11 < sVar96) * sVar11 | (ushort)(sVar11 >= sVar96) * sVar96;
  sVar12 = auVar134._10_2_;
  sVar96 = auVar106._10_2_;
  uVar146 = (ushort)(sVar12 < sVar96) * sVar12 | (ushort)(sVar12 >= sVar96) * sVar96;
  sVar13 = auVar134._12_2_;
  sVar96 = auVar106._12_2_;
  sVar99 = auVar106._14_2_;
  uVar147 = (ushort)(sVar13 < sVar96) * sVar13 | (ushort)(sVar13 >= sVar96) * sVar96;
  sVar14 = auVar134._14_2_;
  uVar148 = (ushort)(sVar14 < sVar99) * sVar14 | (ushort)(sVar14 >= sVar99) * sVar99;
  sVar96 = auVar130._0_2_;
  auVar125._0_2_ = (ushort)((short)uVar140 < sVar96) * sVar96 | ((short)uVar140 >= sVar96) * uVar140
  ;
  sVar99 = auVar130._2_2_;
  auVar125._2_2_ = (ushort)((short)uVar142 < sVar99) * sVar99 | ((short)uVar142 >= sVar99) * uVar142
  ;
  sVar100 = auVar130._4_2_;
  auVar125._4_2_ =
       (ushort)((short)uVar143 < sVar100) * sVar100 | ((short)uVar143 >= sVar100) * uVar143;
  sVar101 = auVar130._6_2_;
  auVar125._6_2_ =
       (ushort)((short)uVar144 < sVar101) * sVar101 | ((short)uVar144 >= sVar101) * uVar144;
  sVar141 = auVar130._8_2_;
  auVar125._8_2_ =
       (ushort)((short)uVar145 < sVar141) * sVar141 | ((short)uVar145 >= sVar141) * uVar145;
  sVar6 = auVar130._10_2_;
  auVar125._10_2_ = (ushort)((short)uVar146 < sVar6) * sVar6 | ((short)uVar146 >= sVar6) * uVar146;
  sVar7 = auVar130._12_2_;
  auVar125._12_2_ = (ushort)((short)uVar147 < sVar7) * sVar7 | ((short)uVar147 >= sVar7) * uVar147;
  sVar8 = auVar130._14_2_;
  auVar125._14_2_ = (ushort)((short)uVar148 < sVar8) * sVar8 | ((short)uVar148 >= sVar8) * uVar148;
  auVar106 = psubsw(auVar125 >> 0x40 & auVar136,auVar125);
  auVar106 = psubsw(auVar106,auVar125);
  auVar106 = psubsw(auVar106,auVar125);
  auVar127._0_2_ = -(ushort)(auVar109._0_2_ == 0);
  auVar127._2_2_ = -(ushort)(auVar109._2_2_ == 0);
  auVar127._4_2_ = -(ushort)(auVar109._4_2_ == 0);
  auVar127._6_2_ = -(ushort)(auVar109._6_2_ == 0);
  auVar127._8_2_ = -(ushort)(auVar109._8_2_ == 0);
  auVar127._10_2_ = -(ushort)(auVar109._10_2_ == 0);
  auVar127._12_2_ = -(ushort)(auVar109._12_2_ == 0);
  auVar127._14_2_ = -(ushort)(auVar109._14_2_ == 0);
  sVar61 = auVar106._0_2_;
  uVar140 = (ushort)(sVar115 < sVar61) * sVar115 | (ushort)(sVar115 >= sVar61) * sVar61;
  sVar61 = auVar106._2_2_;
  uVar142 = (ushort)(sVar122 < sVar61) * sVar122 | (ushort)(sVar122 >= sVar61) * sVar61;
  sVar61 = auVar106._4_2_;
  uVar143 = (ushort)(sVar9 < sVar61) * sVar9 | (ushort)(sVar9 >= sVar61) * sVar61;
  sVar61 = auVar106._6_2_;
  uVar144 = (ushort)(sVar10 < sVar61) * sVar10 | (ushort)(sVar10 >= sVar61) * sVar61;
  sVar61 = auVar106._8_2_;
  uVar145 = (ushort)(sVar11 < sVar61) * sVar11 | (ushort)(sVar11 >= sVar61) * sVar61;
  sVar61 = auVar106._10_2_;
  uVar146 = (ushort)(sVar12 < sVar61) * sVar12 | (ushort)(sVar12 >= sVar61) * sVar61;
  sVar61 = auVar106._12_2_;
  sVar69 = auVar106._14_2_;
  uVar147 = (ushort)(sVar13 < sVar61) * sVar13 | (ushort)(sVar13 >= sVar61) * sVar61;
  uVar148 = (ushort)(sVar14 < sVar69) * sVar14 | (ushort)(sVar14 >= sVar69) * sVar69;
  auVar97._0_2_ = (ushort)((short)uVar140 < sVar96) * sVar96 | ((short)uVar140 >= sVar96) * uVar140;
  auVar97._2_2_ = (ushort)((short)uVar142 < sVar99) * sVar99 | ((short)uVar142 >= sVar99) * uVar142;
  auVar97._4_2_ =
       (ushort)((short)uVar143 < sVar100) * sVar100 | ((short)uVar143 >= sVar100) * uVar143;
  auVar97._6_2_ =
       (ushort)((short)uVar144 < sVar101) * sVar101 | ((short)uVar144 >= sVar101) * uVar144;
  auVar97._8_2_ =
       (ushort)((short)uVar145 < sVar141) * sVar141 | ((short)uVar145 >= sVar141) * uVar145;
  auVar97._10_2_ = (ushort)((short)uVar146 < sVar6) * sVar6 | ((short)uVar146 >= sVar6) * uVar146;
  auVar97._12_2_ = (ushort)((short)uVar147 < sVar7) * sVar7 | ((short)uVar147 >= sVar7) * uVar147;
  auVar97._14_2_ = (ushort)((short)uVar148 < sVar8) * sVar8 | ((short)uVar148 >= sVar8) * uVar148;
  auVar97 = auVar97 & auVar127;
  auVar130._0_8_ = auVar97._0_8_;
  auVar130._8_4_ = auVar97._0_4_;
  auVar130._12_4_ = auVar97._4_4_;
  auVar106 = paddsw(auVar130,_DAT_0051a5c0);
  sVar61 = auVar106._0_2_;
  uVar140 = (ushort)(sVar115 < sVar61) * sVar115 | (ushort)(sVar115 >= sVar61) * sVar61;
  sVar61 = auVar106._2_2_;
  uVar142 = (ushort)(sVar122 < sVar61) * sVar122 | (ushort)(sVar122 >= sVar61) * sVar61;
  sVar61 = auVar106._4_2_;
  uVar143 = (ushort)(sVar9 < sVar61) * sVar9 | (ushort)(sVar9 >= sVar61) * sVar61;
  sVar61 = auVar106._6_2_;
  uVar144 = (ushort)(sVar10 < sVar61) * sVar10 | (ushort)(sVar10 >= sVar61) * sVar61;
  sVar61 = auVar106._8_2_;
  uVar145 = (ushort)(sVar11 < sVar61) * sVar11 | (ushort)(sVar11 >= sVar61) * sVar61;
  sVar61 = auVar106._10_2_;
  uVar146 = (ushort)(sVar12 < sVar61) * sVar12 | (ushort)(sVar12 >= sVar61) * sVar61;
  sVar61 = auVar106._12_2_;
  sVar69 = auVar106._14_2_;
  uVar147 = (ushort)(sVar13 < sVar61) * sVar13 | (ushort)(sVar13 >= sVar61) * sVar61;
  uVar148 = (ushort)(sVar14 < sVar69) * sVar14 | (ushort)(sVar14 >= sVar69) * sVar69;
  auVar64._0_2_ = (ushort)((short)uVar140 < sVar96) * sVar96 | ((short)uVar140 >= sVar96) * uVar140;
  auVar64._2_2_ = (ushort)((short)uVar142 < sVar99) * sVar99 | ((short)uVar142 >= sVar99) * uVar142;
  auVar64._4_2_ =
       (ushort)((short)uVar143 < sVar100) * sVar100 | ((short)uVar143 >= sVar100) * uVar143;
  auVar64._6_2_ =
       (ushort)((short)uVar144 < sVar101) * sVar101 | ((short)uVar144 >= sVar101) * uVar144;
  auVar64._8_2_ =
       (ushort)((short)uVar145 < sVar141) * sVar141 | ((short)uVar145 >= sVar141) * uVar145;
  auVar64._10_2_ = (ushort)((short)uVar146 < sVar6) * sVar6 | ((short)uVar146 >= sVar6) * uVar146;
  auVar64._12_2_ = (ushort)((short)uVar147 < sVar7) * sVar7 | ((short)uVar147 >= sVar7) * uVar147;
  auVar64._14_2_ = (ushort)((short)uVar148 < sVar8) * sVar8 | ((short)uVar148 >= sVar8) * uVar148;
  auVar106 = psraw(auVar64,3);
  auVar98._0_2_ = auVar106._0_2_ + 1;
  auVar98._2_2_ = auVar106._2_2_ + 1;
  auVar98._4_2_ = auVar106._4_2_ + 1;
  auVar98._6_2_ = auVar106._6_2_ + 1;
  auVar98._8_2_ = auVar106._0_2_ + 1;
  auVar98._10_2_ = auVar106._2_2_ + 1;
  auVar98._12_2_ = auVar106._4_2_ + 1;
  auVar98._14_2_ = auVar106._6_2_ + 1;
  auVar109 = psraw(auVar98,1);
  auVar111._8_8_ = SUB168(~auVar136 & auVar109,8);
  auVar111._0_8_ = auVar106._8_8_;
  auVar65._8_8_ = SUB168(~auVar136 & auVar109,0);
  auVar65._0_8_ = auVar106._0_8_;
  auVar106 = psubsw(auVar81,auVar65);
  auVar103 = paddsw(auVar111,auVar103);
  sVar61 = auVar106._0_2_;
  uVar140 = (ushort)(sVar115 < sVar61) * sVar115 | (ushort)(sVar115 >= sVar61) * sVar61;
  sVar61 = auVar106._2_2_;
  uVar142 = (ushort)(sVar122 < sVar61) * sVar122 | (ushort)(sVar122 >= sVar61) * sVar61;
  sVar61 = auVar106._4_2_;
  uVar143 = (ushort)(sVar9 < sVar61) * sVar9 | (ushort)(sVar9 >= sVar61) * sVar61;
  sVar61 = auVar106._6_2_;
  uVar144 = (ushort)(sVar10 < sVar61) * sVar10 | (ushort)(sVar10 >= sVar61) * sVar61;
  sVar61 = auVar106._8_2_;
  uVar145 = (ushort)(sVar11 < sVar61) * sVar11 | (ushort)(sVar11 >= sVar61) * sVar61;
  sVar61 = auVar106._10_2_;
  uVar146 = (ushort)(sVar12 < sVar61) * sVar12 | (ushort)(sVar12 >= sVar61) * sVar61;
  sVar61 = auVar106._12_2_;
  sVar69 = auVar106._14_2_;
  uVar147 = (ushort)(sVar13 < sVar61) * sVar13 | (ushort)(sVar13 >= sVar61) * sVar61;
  uVar148 = (ushort)(sVar14 < sVar69) * sVar14 | (ushort)(sVar14 >= sVar69) * sVar69;
  sVar61 = auVar103._0_2_;
  uVar107 = (ushort)(sVar115 < sVar61) * sVar115 | (ushort)(sVar115 >= sVar61) * sVar61;
  sVar115 = auVar103._2_2_;
  uVar114 = (ushort)(sVar122 < sVar115) * sVar122 | (ushort)(sVar122 >= sVar115) * sVar115;
  sVar115 = auVar103._4_2_;
  uVar116 = (ushort)(sVar9 < sVar115) * sVar9 | (ushort)(sVar9 >= sVar115) * sVar115;
  sVar115 = auVar103._6_2_;
  uVar117 = (ushort)(sVar10 < sVar115) * sVar10 | (ushort)(sVar10 >= sVar115) * sVar115;
  sVar115 = auVar103._8_2_;
  uVar118 = (ushort)(sVar11 < sVar115) * sVar11 | (ushort)(sVar11 >= sVar115) * sVar115;
  sVar115 = auVar103._10_2_;
  uVar119 = (ushort)(sVar12 < sVar115) * sVar12 | (ushort)(sVar12 >= sVar115) * sVar115;
  sVar115 = auVar103._12_2_;
  sVar122 = auVar103._14_2_;
  uVar120 = (ushort)(sVar13 < sVar115) * sVar13 | (ushort)(sVar13 >= sVar115) * sVar115;
  uVar121 = (ushort)(sVar14 < sVar122) * sVar14 | (ushort)(sVar14 >= sVar122) * sVar122;
  auVar82._0_2_ = (ushort)((short)uVar140 < sVar96) * sVar96 | ((short)uVar140 >= sVar96) * uVar140;
  auVar82._2_2_ = (ushort)((short)uVar142 < sVar99) * sVar99 | ((short)uVar142 >= sVar99) * uVar142;
  auVar82._4_2_ =
       (ushort)((short)uVar143 < sVar100) * sVar100 | ((short)uVar143 >= sVar100) * uVar143;
  auVar82._6_2_ =
       (ushort)((short)uVar144 < sVar101) * sVar101 | ((short)uVar144 >= sVar101) * uVar144;
  auVar82._8_2_ =
       (ushort)((short)uVar145 < sVar141) * sVar141 | ((short)uVar145 >= sVar141) * uVar145;
  auVar82._10_2_ = (ushort)((short)uVar146 < sVar6) * sVar6 | ((short)uVar146 >= sVar6) * uVar146;
  auVar82._12_2_ = (ushort)((short)uVar147 < sVar7) * sVar7 | ((short)uVar147 >= sVar7) * uVar147;
  auVar82._14_2_ = (ushort)((short)uVar148 < sVar8) * sVar8 | ((short)uVar148 >= sVar8) * uVar148;
  auVar112._0_2_ = (ushort)((short)uVar107 < sVar96) * sVar96 | ((short)uVar107 >= sVar96) * uVar107
  ;
  auVar112._2_2_ = (ushort)((short)uVar114 < sVar99) * sVar99 | ((short)uVar114 >= sVar99) * uVar114
  ;
  auVar112._4_2_ =
       (ushort)((short)uVar116 < sVar100) * sVar100 | ((short)uVar116 >= sVar100) * uVar116;
  auVar112._6_2_ =
       (ushort)((short)uVar117 < sVar101) * sVar101 | ((short)uVar117 >= sVar101) * uVar117;
  auVar112._8_2_ =
       (ushort)((short)uVar118 < sVar141) * sVar141 | ((short)uVar118 >= sVar141) * uVar118;
  auVar112._10_2_ = (ushort)((short)uVar119 < sVar6) * sVar6 | ((short)uVar119 >= sVar6) * uVar119;
  auVar112._12_2_ = (ushort)((short)uVar120 < sVar7) * sVar7 | ((short)uVar120 >= sVar7) * uVar120;
  auVar112._14_2_ = (ushort)((short)uVar121 < sVar8) * sVar8 | ((short)uVar121 >= sVar8) * uVar121;
  auVar81 = paddsw(auVar82,auVar128);
  auVar134 = paddsw(auVar112,auVar128);
  auVar103 = psubusw(auVar79,auVar92);
  auVar106 = psubusw(auVar92,auVar79);
  auVar106 = auVar106 | auVar103;
  sVar96 = auVar106._0_2_;
  auVar66._0_2_ = (ushort)(sVar96 < sVar2) * sVar2 | (ushort)(sVar96 >= sVar2) * sVar96;
  sVar96 = auVar106._2_2_;
  auVar66._2_2_ = (ushort)(sVar96 < sVar3) * sVar3 | (ushort)(sVar96 >= sVar3) * sVar96;
  sVar96 = auVar106._4_2_;
  auVar66._4_2_ = (ushort)(sVar96 < sVar4) * sVar4 | (ushort)(sVar96 >= sVar4) * sVar96;
  sVar96 = auVar106._6_2_;
  auVar66._6_2_ = (ushort)(sVar96 < sVar5) * sVar5 | (ushort)(sVar96 >= sVar5) * sVar96;
  sVar96 = auVar106._8_2_;
  auVar66._8_2_ = (ushort)(sVar96 < sVar129) * sVar129 | (ushort)(sVar96 >= sVar129) * sVar96;
  sVar96 = auVar106._10_2_;
  auVar66._10_2_ = (ushort)(sVar96 < sVar137) * sVar137 | (ushort)(sVar96 >= sVar137) * sVar96;
  sVar96 = auVar106._12_2_;
  sVar99 = auVar106._14_2_;
  auVar66._12_2_ = (ushort)(sVar96 < sVar138) * sVar138 | (ushort)(sVar96 >= sVar138) * sVar96;
  auVar66._14_2_ = (ushort)(sVar99 < sVar139) * sVar139 | (ushort)(sVar99 >= sVar139) * sVar99;
  auVar63 = psllw(_DAT_0051a5b0,auVar63);
  auVar103._0_2_ =
       ((short)auVar66._8_2_ < (short)auVar66._0_2_) * auVar66._0_2_ |
       ((short)auVar66._8_2_ >= (short)auVar66._0_2_) * auVar66._8_2_;
  auVar103._2_2_ =
       ((short)auVar66._10_2_ < (short)auVar66._2_2_) * auVar66._2_2_ |
       ((short)auVar66._10_2_ >= (short)auVar66._2_2_) * auVar66._10_2_;
  auVar103._4_2_ =
       ((short)auVar66._12_2_ < (short)auVar66._4_2_) * auVar66._4_2_ |
       ((short)auVar66._12_2_ >= (short)auVar66._4_2_) * auVar66._12_2_;
  auVar103._6_2_ =
       ((short)auVar66._14_2_ < (short)auVar66._6_2_) * auVar66._6_2_ |
       ((short)auVar66._14_2_ >= (short)auVar66._6_2_) * auVar66._14_2_;
  auVar103._8_2_ = (0 < (short)auVar66._8_2_) * auVar66._8_2_;
  auVar103._10_2_ = (0 < (short)auVar66._10_2_) * auVar66._10_2_;
  auVar103._12_2_ = (0 < (short)auVar66._12_2_) * auVar66._12_2_;
  auVar103._14_2_ = (0 < (short)auVar66._14_2_) * auVar66._14_2_;
  auVar103 = psubusw(auVar103,auVar63);
  auVar63._0_2_ = -(ushort)(auVar103._0_2_ == 0);
  auVar63._2_2_ = -(ushort)(auVar103._2_2_ == 0);
  auVar63._4_2_ = -(ushort)(auVar103._4_2_ == 0);
  auVar63._6_2_ = -(ushort)(auVar103._6_2_ == 0);
  auVar63._8_2_ = -(ushort)(auVar103._8_2_ == 0);
  auVar63._10_2_ = -(ushort)(auVar103._10_2_ == 0);
  auVar63._12_2_ = -(ushort)(auVar103._12_2_ == 0);
  auVar63._14_2_ = -(ushort)(auVar103._14_2_ == 0);
  auVar63 = auVar63 & auVar127;
  auVar109._0_8_ = auVar63._0_8_;
  auVar109._8_4_ = auVar63._0_4_;
  auVar109._12_4_ = auVar63._4_4_;
  auVar86._0_2_ = -(ushort)(auVar63._0_2_ == 0);
  auVar86._2_2_ = -(ushort)(auVar63._2_2_ == 0);
  auVar86._4_2_ = -(ushort)(auVar63._4_2_ == 0);
  auVar86._6_2_ = -(ushort)(auVar63._6_2_ == 0);
  auVar86._8_2_ = -(ushort)(auVar63._0_2_ == 0);
  auVar86._10_2_ = -(ushort)(auVar63._2_2_ == 0);
  auVar86._12_2_ = -(ushort)(auVar63._4_2_ == 0);
  auVar86._14_2_ = -(ushort)(auVar63._6_2_ == 0);
  if ((ushort)((ushort)(SUB161(auVar86 >> 7,0) & 1) | (ushort)(SUB161(auVar86 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar86 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar86 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar86 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar86 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar86 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar86 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar86 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar86 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar86 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar86 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar86 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar86 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar86._14_2_ >> 7) & 1) << 0xe | auVar86._14_2_ & 0x8000) != 0xffff
     ) {
    sVar96 = sVar94 + sVar94 + sVar93 + sVar93 + sVar87 + 4;
    sVar99 = uVar38 + uVar38 + uVar37 + uVar37 + uVar36 + 4;
    sVar100 = sVar77 + sVar77 + sVar76 + sVar76 + sVar70 + 4;
    sVar101 = uVar44 + uVar44 + uVar43 + uVar43 + uVar42 + 4;
    uVar140 = sVar95 * 2 + sVar67 + sVar96;
    uVar142 = uVar39 * 2 + uVar40 + sVar99;
    uVar143 = sVar78 * 2 + sVar84 + sVar100;
    uVar144 = uVar45 * 2 + uVar46 + sVar101;
    auVar66 = ~auVar109 & auVar134;
    auVar113._0_2_ = uVar140 >> 3;
    auVar113._2_2_ = uVar142 >> 3;
    auVar113._4_2_ = uVar143 >> 3;
    auVar113._6_2_ = uVar144 >> 3;
    auVar113._8_2_ = (ushort)(sVar87 * 2 + sVar95 + sVar96) >> 3;
    auVar113._10_2_ = (ushort)(uVar36 * 2 + uVar39 + sVar99) >> 3;
    auVar113._12_2_ = (ushort)(sVar70 * 2 + sVar78 + sVar100) >> 3;
    auVar113._14_2_ = (ushort)(uVar42 * 2 + uVar45 + sVar101) >> 3;
    auVar79 = ~auVar109 & auVar81;
    uVar140 = ((sVar67 + sVar68) - (sVar93 + sVar87)) + uVar140;
    uVar142 = ((uVar40 + uVar41) - (uVar37 + uVar36)) + uVar142;
    uVar143 = ((sVar84 + sVar85) - (sVar76 + sVar70)) + uVar143;
    uVar144 = ((uVar46 + uVar47) - (uVar43 + uVar42)) + uVar144;
    auVar83._0_2_ = uVar140 >> 3;
    auVar83._2_2_ = uVar142 >> 3;
    auVar83._4_2_ = uVar143 >> 3;
    auVar83._6_2_ = uVar144 >> 3;
    auVar83._8_2_ = (ushort)((sVar68 * 2 - (sVar94 + sVar93)) + uVar140) >> 3;
    auVar83._10_2_ = (ushort)((uVar41 * 2 - (uVar38 + uVar37)) + uVar142) >> 3;
    auVar83._12_2_ = (ushort)((sVar85 * 2 - (sVar77 + sVar76)) + uVar143) >> 3;
    auVar83._14_2_ = (ushort)((uVar47 * 2 - (uVar44 + uVar43)) + uVar144) >> 3;
    auVar81 = auVar83 & auVar109 | auVar79;
    auVar134 = auVar113 & auVar109 | auVar66;
  }
  auVar60._4_4_ = auVar134._8_4_;
  auVar60._0_4_ = auVar134._0_4_;
  auVar60._8_4_ = auVar134._4_4_;
  auVar60._12_4_ = auVar134._12_4_;
  auVar63 = pshufhw(auVar66,auVar60,0x72);
  auVar103 = pshuflw(auVar60,auVar60,0x72);
  auVar75._4_4_ = auVar81._8_4_;
  auVar75._0_4_ = auVar81._0_4_;
  auVar75._8_4_ = auVar81._4_4_;
  auVar75._12_4_ = auVar81._12_4_;
  auVar81 = pshufhw(auVar79,auVar75,0xd8);
  auVar106 = pshuflw(auVar75,auVar75,0xd8);
  *(ulong *)(s + -2) = CONCAT44(auVar106._0_4_,auVar103._0_4_);
  *(ulong *)(s + (long)p + -2) = CONCAT44(auVar106._4_4_,auVar103._4_4_);
  *(ulong *)(s + (long)(p * 2) + -2) = CONCAT44(auVar81._8_4_,auVar63._8_4_);
  *(ulong *)(s + (long)(p * 3) + -2) = CONCAT44(auVar81._12_4_,auVar63._12_4_);
  return;
}

Assistant:

void aom_highbd_lpf_vertical_6_sse2(uint16_t *s, int p, const uint8_t *blimit,
                                    const uint8_t *limit, const uint8_t *thresh,
                                    int bd) {
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i x3, x2, x1, x0, p0, q0;
  __m128i p1p0, q1q0;

  x3 = _mm_loadu_si128((__m128i *)((s - 3) + 0 * p));
  x2 = _mm_loadu_si128((__m128i *)((s - 3) + 1 * p));
  x1 = _mm_loadu_si128((__m128i *)((s - 3) + 2 * p));
  x0 = _mm_loadu_si128((__m128i *)((s - 3) + 3 * p));

  highbd_transpose4x8_8x4_sse2(&x3, &x2, &x1, &x0, &d0, &d1, &d2, &d3, &d4, &d5,
                               &d6, &d7);

  highbd_lpf_internal_6_sse2(&d0, &d1, &d2, &d3, &d4, &d5, &p1p0, &q1q0, blimit,
                             limit, thresh, bd);

  p0 = _mm_srli_si128(p1p0, 8);
  q0 = _mm_srli_si128(q1q0, 8);

  highbd_transpose4x8_8x4_low_sse2(&p0, &p1p0, &q1q0, &q0, &d0, &d1, &d2, &d3);

  _mm_storel_epi64((__m128i *)(s - 2 + 0 * p), d0);
  _mm_storel_epi64((__m128i *)(s - 2 + 1 * p), d1);
  _mm_storel_epi64((__m128i *)(s - 2 + 2 * p), d2);
  _mm_storel_epi64((__m128i *)(s - 2 + 3 * p), d3);
}